

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

OSAttribute * __thiscall ObjectFile::getAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  mapped_type *ppOVar1;
  undefined8 in_RDX;
  OSAttribute *in_RDI;
  OSAttribute *attr;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  OSAttribute *this_00;
  OSAttribute *in_stack_ffffffffffffffc8;
  key_type *in_stack_ffffffffffffffd8;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  MutexLocker::MutexLocker((MutexLocker *)in_RDI,in_stack_ffffffffffffff98);
  ppOVar1 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (*ppOVar1 == (OSAttribute *)0x0) {
    softHSMLog(3,"getAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x6f,"The attribute does not exist: 0x%08X",in_RDX);
    OSAttribute::OSAttribute(this_00,(unsigned_long)in_stack_ffffffffffffff98);
  }
  else {
    OSAttribute::OSAttribute(*ppOVar1,in_stack_ffffffffffffffc8);
  }
  MutexLocker::~MutexLocker((MutexLocker *)this_00);
  return in_RDI;
}

Assistant:

OSAttribute ObjectFile::getAttribute(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	OSAttribute* attr = attributes[type];
	if (attr == NULL)
	{
		ERROR_MSG("The attribute does not exist: 0x%08X", type);
		return OSAttribute((unsigned long)0);
	}

	return *attr;
}